

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O0

obj * tt_oname(obj *otmp)

{
  int iVar1;
  uint uVar2;
  toptenentry *__ptr;
  bool bVar3;
  toptenentry *tt;
  toptenentry *toptenlist;
  int fd;
  int rank;
  obj *otmp_local;
  
  if (otmp == (obj *)0x0) {
    otmp_local = (obj *)0x0;
  }
  else {
    iVar1 = open_datafile("record",0,2);
    __ptr = read_topten(iVar1,100);
    close(iVar1);
    toptenlist._4_4_ = rn2(100);
    while( true ) {
      bVar3 = false;
      if ((__ptr[toptenlist._4_4_].points < 1) &&
         (bVar3 = false, __ptr[toptenlist._4_4_].deathlev == 0)) {
        bVar3 = toptenlist._4_4_ != 0;
      }
      if (!bVar3) break;
      toptenlist._4_4_ = rn2(toptenlist._4_4_);
    }
    if ((__ptr[toptenlist._4_4_].points < 1) && (__ptr[toptenlist._4_4_].deathlev == 0)) {
      _fd = (obj *)0x0;
    }
    else {
      if (otmp->otyp == 0x10e) {
        obj_stop_timers(otmp);
      }
      iVar1 = classmon(__ptr[toptenlist._4_4_].plrole,__ptr[toptenlist._4_4_].plgend[0] == 'F');
      otmp->corpsenm = iVar1;
      uVar2 = weight(otmp);
      otmp->owt = uVar2;
      _fd = oname(otmp,__ptr[toptenlist._4_4_].name);
      if (_fd->otyp == 0x10e) {
        start_corpse_timeout(_fd);
      }
    }
    free(__ptr);
    otmp_local = _fd;
  }
  return otmp_local;
}

Assistant:

struct obj *tt_oname(struct obj *otmp)
{
    int rank, fd;
    struct toptenentry *toptenlist, *tt;

    if (!otmp)
	return NULL;

    fd = open_datafile(RECORD, O_RDONLY, SCOREPREFIX);
    toptenlist = read_topten(fd, 100); /* load the top 100 scores */
    close(fd);
    
    /* try to find a valid entry, reducing the value range for rank each time */
    rank = rn2(100);
    while (!validentry(toptenlist[rank]) && rank)
	rank = rn2(rank);
    
    tt = &toptenlist[rank];
    
    if (!validentry(toptenlist[rank]))
	otmp = NULL; /* the topten list is empty */
    else {
	/* reset timer in case corpse started out as lizard or troll */
	if (otmp->otyp == CORPSE)
	    obj_stop_timers(otmp);
	otmp->corpsenm = classmon(tt->plrole, (tt->plgend[0] == 'F'));
	otmp->owt = weight(otmp);
	otmp = oname(otmp, tt->name);
	if (otmp->otyp == CORPSE)
	    start_corpse_timeout(otmp);
    }
    
    free(toptenlist);
    return otmp;
}